

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int walBeginShmUnreliable(Wal *pWal,int *pChanged)

{
  int amt;
  int iVar1;
  int *__dest;
  WalIndexHdr *__src;
  u32 local_84;
  int local_80;
  u32 local_7c;
  int i;
  u32 nTruncate;
  u32 pgno;
  u32 aSaveCksum [2];
  int rc;
  void *pDummy;
  u8 *aData;
  u8 *puStack_50;
  int szFrame;
  u8 *aFrame;
  u8 aBuf [32];
  i64 iOffset;
  i64 szWal;
  int *pChanged_local;
  Wal *pWal_local;
  
  puStack_50 = (u8 *)0x0;
  szWal = (i64)pChanged;
  pChanged_local = (int *)pWal;
  aSaveCksum[0] = walLockShared(pWal,3);
  if (aSaveCksum[0] == 0) {
    *(undefined2 *)(pChanged_local + 0xf) = 0;
    local_84 = sqlite3OsShmMap(*(sqlite3_file **)(pChanged_local + 2),0,0x8000,0,
                               (void **)(aSaveCksum + 1));
    if (local_84 == 0x508) {
      __dest = pChanged_local + 0x12;
      aSaveCksum[0] = local_84;
      __src = walIndexHdr((Wal *)pChanged_local);
      memcpy(__dest,__src,0x30);
      aSaveCksum[0] = sqlite3OsFileSize(*(sqlite3_file **)(pChanged_local + 4),&iOffset);
      if (aSaveCksum[0] == 0) {
        if (iOffset < 0x20) {
          *(undefined4 *)szWal = 1;
          aSaveCksum[0] = 0xffffffff;
          if (pChanged_local[0x16] == 0) {
            aSaveCksum[0] = 0;
          }
        }
        else {
          aSaveCksum[0] = sqlite3OsRead(*(sqlite3_file **)(pChanged_local + 4),&aFrame,0x20,0);
          if (aSaveCksum[0] == 0) {
            if (*(long *)(pChanged_local + 0x1a) == aBuf._8_8_) {
              amt = *(ushort *)((long)pChanged_local + 0x56) + 0x18;
              puStack_50 = (u8 *)sqlite3_malloc64((long)amt);
              if (puStack_50 == (u8 *)0x0) {
                aSaveCksum[0] = 7;
              }
              else {
                nTruncate = pChanged_local[0x18];
                pgno = pChanged_local[0x19];
                aBuf._24_8_ = (ulong)(uint)pChanged_local[0x16] *
                              (long)(int)(*(ushort *)((long)pChanged_local + 0x56) + 0x18) + 0x20;
                while( true ) {
                  if (((iOffset < aBuf._24_8_ + (long)amt) ||
                      (aSaveCksum[0] =
                            sqlite3OsRead(*(sqlite3_file **)(pChanged_local + 4),puStack_50,amt,
                                          aBuf._24_8_), aSaveCksum[0] != 0)) ||
                     (iVar1 = walDecodeFrame((Wal *)pChanged_local,(u32 *)&i,&local_7c,
                                             puStack_50 + 0x18,puStack_50), iVar1 == 0))
                  goto LAB_001621e3;
                  if (local_7c != 0) break;
                  aBuf._24_8_ = (long)amt + aBuf._24_8_;
                }
                aSaveCksum[0] = 0xffffffff;
LAB_001621e3:
                pChanged_local[0x18] = nTruncate;
                pChanged_local[0x19] = pgno;
              }
            }
            else {
              aSaveCksum[0] = 0xffffffff;
            }
          }
        }
      }
    }
    else {
      if (local_84 == 8) {
        local_84 = 0xffffffff;
      }
      aSaveCksum[0] = local_84;
    }
  }
  else if (aSaveCksum[0] == 5) {
    aSaveCksum[0] = 0xffffffff;
  }
  sqlite3_free(puStack_50);
  if (aSaveCksum[0] != 0) {
    for (local_80 = 0; local_80 < pChanged_local[10]; local_80 = local_80 + 1) {
      sqlite3_free(*(void **)(*(long *)(pChanged_local + 0xc) + (long)local_80 * 8));
      *(undefined8 *)(*(long *)(pChanged_local + 0xc) + (long)local_80 * 8) = 0;
    }
    *(undefined1 *)((long)pChanged_local + 0x46) = 0;
    sqlite3WalEndReadTransaction((Wal *)pChanged_local);
    *(undefined4 *)szWal = 1;
  }
  return aSaveCksum[0];
}

Assistant:

static int walBeginShmUnreliable(Wal *pWal, int *pChanged){
  i64 szWal;                      /* Size of wal file on disk in bytes */
  i64 iOffset;                    /* Current offset when reading wal file */
  u8 aBuf[WAL_HDRSIZE];           /* Buffer to load WAL header into */
  u8 *aFrame = 0;                 /* Malloc'd buffer to load entire frame */
  int szFrame;                    /* Number of bytes in buffer aFrame[] */
  u8 *aData;                      /* Pointer to data part of aFrame buffer */
  volatile void *pDummy;          /* Dummy argument for xShmMap */
  int rc;                         /* Return code */
  u32 aSaveCksum[2];              /* Saved copy of pWal->hdr.aFrameCksum */

  assert( pWal->bShmUnreliable );
  assert( pWal->readOnly & WAL_SHM_RDONLY );
  assert( pWal->nWiData>0 && pWal->apWiData[0] );

  /* Take WAL_READ_LOCK(0). This has the effect of preventing any
  ** writers from running a checkpoint, but does not stop them
  ** from running recovery.  */
  rc = walLockShared(pWal, WAL_READ_LOCK(0));
  if( rc!=SQLITE_OK ){
    if( rc==SQLITE_BUSY ) rc = WAL_RETRY;
    goto begin_unreliable_shm_out;
  }
  pWal->readLock = 0;

  /* Check to see if a separate writer has attached to the shared-memory area,
  ** thus making the shared-memory "reliable" again.  Do this by invoking
  ** the xShmMap() routine of the VFS and looking to see if the return
  ** is SQLITE_READONLY instead of SQLITE_READONLY_CANTINIT.
  **
  ** If the shared-memory is now "reliable" return WAL_RETRY, which will
  ** cause the heap-memory WAL-index to be discarded and the actual
  ** shared memory to be used in its place.
  **
  ** This step is important because, even though this connection is holding
  ** the WAL_READ_LOCK(0) which prevents a checkpoint, a writer might
  ** have already checkpointed the WAL file and, while the current
  ** is active, wrap the WAL and start overwriting frames that this
  ** process wants to use.
  **
  ** Once sqlite3OsShmMap() has been called for an sqlite3_file and has
  ** returned any SQLITE_READONLY value, it must return only SQLITE_READONLY
  ** or SQLITE_READONLY_CANTINIT or some error for all subsequent invocations,
  ** even if some external agent does a "chmod" to make the shared-memory
  ** writable by us, until sqlite3OsShmUnmap() has been called.
  ** This is a requirement on the VFS implementation.
   */
  rc = sqlite3OsShmMap(pWal->pDbFd, 0, WALINDEX_PGSZ, 0, &pDummy);
  assert( rc!=SQLITE_OK ); /* SQLITE_OK not possible for read-only connection */
  if( rc!=SQLITE_READONLY_CANTINIT ){
    rc = (rc==SQLITE_READONLY ? WAL_RETRY : rc);
    goto begin_unreliable_shm_out;
  }

  /* We reach this point only if the real shared-memory is still unreliable.
  ** Assume the in-memory WAL-index substitute is correct and load it
  ** into pWal->hdr.
  */
  memcpy(&pWal->hdr, (void*)walIndexHdr(pWal), sizeof(WalIndexHdr));

  /* Make sure some writer hasn't come in and changed the WAL file out
  ** from under us, then disconnected, while we were not looking.
  */
  rc = sqlite3OsFileSize(pWal->pWalFd, &szWal);
  if( rc!=SQLITE_OK ){
    goto begin_unreliable_shm_out;
  }
  if( szWal<WAL_HDRSIZE ){
    /* If the wal file is too small to contain a wal-header and the
    ** wal-index header has mxFrame==0, then it must be safe to proceed
    ** reading the database file only. However, the page cache cannot
    ** be trusted, as a read/write connection may have connected, written
    ** the db, run a checkpoint, truncated the wal file and disconnected
    ** since this client's last read transaction.  */
    *pChanged = 1;
    rc = (pWal->hdr.mxFrame==0 ? SQLITE_OK : WAL_RETRY);
    goto begin_unreliable_shm_out;
  }

  /* Check the salt keys at the start of the wal file still match. */
  rc = sqlite3OsRead(pWal->pWalFd, aBuf, WAL_HDRSIZE, 0);
  if( rc!=SQLITE_OK ){
    goto begin_unreliable_shm_out;
  }
  if( memcmp(&pWal->hdr.aSalt, &aBuf[16], 8) ){
    /* Some writer has wrapped the WAL file while we were not looking.
    ** Return WAL_RETRY which will cause the in-memory WAL-index to be
    ** rebuilt. */
    rc = WAL_RETRY;
    goto begin_unreliable_shm_out;
  }

  /* Allocate a buffer to read frames into */
  szFrame = pWal->hdr.szPage + WAL_FRAME_HDRSIZE;
  aFrame = (u8 *)sqlite3_malloc64(szFrame);
  if( aFrame==0 ){
    rc = SQLITE_NOMEM_BKPT;
    goto begin_unreliable_shm_out;
  }
  aData = &aFrame[WAL_FRAME_HDRSIZE];

  /* Check to see if a complete transaction has been appended to the
  ** wal file since the heap-memory wal-index was created. If so, the
  ** heap-memory wal-index is discarded and WAL_RETRY returned to
  ** the caller.  */
  aSaveCksum[0] = pWal->hdr.aFrameCksum[0];
  aSaveCksum[1] = pWal->hdr.aFrameCksum[1];
  for(iOffset=walFrameOffset(pWal->hdr.mxFrame+1, pWal->hdr.szPage); 
      iOffset+szFrame<=szWal; 
      iOffset+=szFrame
  ){
    u32 pgno;                   /* Database page number for frame */
    u32 nTruncate;              /* dbsize field from frame header */

    /* Read and decode the next log frame. */
    rc = sqlite3OsRead(pWal->pWalFd, aFrame, szFrame, iOffset);
    if( rc!=SQLITE_OK ) break;
    if( !walDecodeFrame(pWal, &pgno, &nTruncate, aData, aFrame) ) break;

    /* If nTruncate is non-zero, then a complete transaction has been
    ** appended to this wal file. Set rc to WAL_RETRY and break out of
    ** the loop.  */
    if( nTruncate ){
      rc = WAL_RETRY;
      break;
    }
  }
  pWal->hdr.aFrameCksum[0] = aSaveCksum[0];
  pWal->hdr.aFrameCksum[1] = aSaveCksum[1];

 begin_unreliable_shm_out:
  sqlite3_free(aFrame);
  if( rc!=SQLITE_OK ){
    int i;
    for(i=0; i<pWal->nWiData; i++){
      sqlite3_free((void*)pWal->apWiData[i]);
      pWal->apWiData[i] = 0;
    }
    pWal->bShmUnreliable = 0;
    sqlite3WalEndReadTransaction(pWal);
    *pChanged = 1;
  }
  return rc;
}